

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMemory.cpp
# Opt level: O0

void * __thiscall xercesc_4_0::XMemory::operator_new(XMemory *this,size_t size)

{
  XMLSize_t XVar1;
  undefined8 *puVar2;
  void *block;
  size_t headerSize;
  size_t size_local;
  
  XVar1 = XMLPlatformUtils::alignPointerForNewBlockAllocation(8);
  puVar2 = (undefined8 *)
           (**(code **)(*XMLPlatformUtils::fgMemoryManager + 0x18))
                     (XMLPlatformUtils::fgMemoryManager,this + XVar1);
  *puVar2 = XMLPlatformUtils::fgMemoryManager;
  return (void *)((long)puVar2 + XVar1);
}

Assistant:

void* XMemory::operator new(size_t size)
{
	size_t headerSize = XMLPlatformUtils::alignPointerForNewBlockAllocation(
										sizeof(MemoryManager*));
	
    void* const block = XMLPlatformUtils::fgMemoryManager->allocate
        (
	        headerSize + size
        );
    *(MemoryManager**)block = XMLPlatformUtils::fgMemoryManager;

    return (char*)block + headerSize;
}